

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

int __thiscall
QFragmentMapData<QTextFragmentData>::init
          (QFragmentMapData<QTextFragmentData> *this,EVP_PKEY_CTX *ctx)

{
  Header *pHVar1;
  QTextFragmentData *pQVar2;
  QTextFragmentData *newFragments;
  
  pHVar1 = (Header *)realloc((this->field_0).head,0x800);
  if (pHVar1 != (Header *)0x0) {
    (this->field_0).head = pHVar1;
    ((this->field_0).head)->allocated = 0x40;
  }
  qt_noop();
  ((this->field_0).head)->tag = 0x706d6170;
  ((this->field_0).head)->root = 0;
  ((this->field_0).head)->freelist = 1;
  ((this->field_0).head)->node_count = 0;
  pQVar2 = F(this,((this->field_0).head)->freelist);
  (pQVar2->super_QFragment<1>).right = 0;
  return (int)pQVar2;
}

Assistant:

void QFragmentMapData<Fragment>::init()
{
    // the following code will realloc an existing fragment or create a new one.
    // it will also ignore errors when shrinking an existing fragment.
    Fragment *newFragments = (Fragment *)realloc(fragments, 64*fragmentSize);
    if (newFragments) {
        fragments = newFragments;
        head->allocated = 64;
    }
    Q_CHECK_PTR(fragments);

    head->tag = (((quint32)'p') << 24) | (((quint32)'m') << 16) | (((quint32)'a') << 8) | 'p'; //TAG('p', 'm', 'a', 'p');
    head->root = 0;
    head->freelist = 1;
    head->node_count = 0;
    // mark all items to the right as unused
    F(head->freelist).right = 0;
}